

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

void __thiscall Js::ByteCodeWriter::EndSubexpression(ByteCodeWriter *this,ParseNode *node)

{
  bool bVar1;
  uint uVar2;
  SubexpressionNode *pSVar3;
  ScriptContext *this_00;
  Recycler *recycler;
  StatementMap *pStatementMap;
  SubexpressionNode SVar4;
  SubexpressionNode subexpressionNode;
  StatementMap *pCurrentStatement;
  ParseNode *node_local;
  ByteCodeWriter *this_local;
  
  if (((((this->m_isInDebugMode & 1U) != 0) &&
       (bVar1 = JsUtil::
                Stack<Js::ByteCodeWriter::SubexpressionNode,_Memory::ArenaAllocator,_false,_DefaultComparer>
                ::Empty(this->m_subexpressionNodesStack), !bVar1)) &&
      (pSVar3 = JsUtil::
                Stack<Js::ByteCodeWriter::SubexpressionNode,_Memory::ArenaAllocator,_false,_DefaultComparer>
                ::Peek(this->m_subexpressionNodesStack,0), pSVar3->node == node)) &&
     (uVar2 = Data::GetCurrentOffset(&this->m_byteCodeData), uVar2 != this->m_beginCodeSpan)) {
    this_00 = FunctionProxy::GetScriptContext((FunctionProxy *)this->m_functionWrite);
    recycler = ScriptContext::GetRecycler(this_00);
    pStatementMap = FunctionBody::StatementMap::New(recycler);
    if (pStatementMap != (StatementMap *)0x0) {
      (pStatementMap->sourceSpan).begin = node->ichMin;
      (pStatementMap->sourceSpan).end = node->ichLim;
      SVar4 = JsUtil::
              Stack<Js::ByteCodeWriter::SubexpressionNode,_Memory::ArenaAllocator,_false,_DefaultComparer>
              ::Pop(this->m_subexpressionNodesStack);
      (pStatementMap->byteCodeSpan).begin = SVar4.beginCodeSpan;
      uVar2 = Data::GetCurrentOffset(&this->m_byteCodeData);
      (pStatementMap->byteCodeSpan).end = uVar2 - 1;
      pStatementMap->isSubexpression = true;
      FunctionBody::RecordStatementMap(this->m_functionWrite,pStatementMap);
    }
  }
  return;
}

Assistant:

void ByteCodeWriter::EndSubexpression(ParseNode* node)
    {
        if (!m_isInDebugMode || m_subexpressionNodesStack->Empty() || m_subexpressionNodesStack->Peek().node != node)
        {
            return;
        }

        if (m_byteCodeData.GetCurrentOffset() != m_beginCodeSpan)
        {
            FunctionBody::StatementMap* pCurrentStatement = FunctionBody::StatementMap::New(this->m_functionWrite->GetScriptContext()->GetRecycler());

            if (pCurrentStatement)
            {
                pCurrentStatement->sourceSpan.begin = node->ichMin;
                pCurrentStatement->sourceSpan.end = node->ichLim;

                SubexpressionNode subexpressionNode = m_subexpressionNodesStack->Pop();
                pCurrentStatement->byteCodeSpan.begin = subexpressionNode.beginCodeSpan;
                pCurrentStatement->byteCodeSpan.end = m_byteCodeData.GetCurrentOffset() - 1;
                pCurrentStatement->isSubexpression = true;

                m_functionWrite->RecordStatementMap(pCurrentStatement);
            }
        }
    }